

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall luna::State::CallClosure(State *this,Value *f,int expect_result)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint uVar4;
  Function *this_00;
  Instruction *pIVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  Value *pVVar10;
  ulong uVar11;
  Value *pVVar12;
  CallInfo callee;
  CallInfo local_58;
  ulong uVar9;
  
  CallInfo::CallInfo(&local_58);
  this_00 = Closure::GetPrototype((f->field_0).closure_);
  local_58.func_ = f;
  pIVar5 = Function::GetOpCodes(this_00);
  local_58.instruction_ = pIVar5;
  sVar6 = Function::OpCodeSize(this_00);
  local_58.end_ = pIVar5 + sVar6;
  pVVar12 = f + 1;
  local_58.expect_result_ = expect_result;
  uVar4 = Function::FixedArgCount(this_00);
  bVar3 = Function::HasVararg(this_00);
  if (bVar3) {
    local_58.register_ = (this->stack_).top_;
    uVar7 = (uint)((ulong)((long)local_58.register_ - (long)pVVar12) >> 4);
    if ((int)uVar4 <= (int)uVar7) {
      uVar7 = uVar4;
    }
    uVar11 = 0;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar11;
    }
    while (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), iVar8 != 0) {
      puVar1 = (undefined8 *)((long)&(local_58.register_)->field_0 + uVar11);
      puVar2 = (undefined8 *)((long)&pVVar12->field_0 + uVar11);
      *(undefined4 *)(puVar1 + 1) = *(undefined4 *)(puVar2 + 1);
      *puVar1 = *puVar2;
      uVar11 = uVar11 + 0x10;
    }
  }
  else {
    for (pVVar10 = (this->stack_).top_; local_58.register_ = pVVar12, pVVar10 < pVVar12 + (int)uVar4
        ; pVVar10 = pVVar10 + 1) {
      (pVVar10->field_0).obj_ = (GCObject *)0x0;
      pVVar10->type_ = ValueT_Nil;
    }
  }
  Stack::SetNewTop(&this->stack_,local_58.register_ + (int)uVar4);
  std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::push_back
            (&this->calls_,&local_58);
  return;
}

Assistant:

void State::CallClosure(Value *f, int expect_result)
    {
        CallInfo callee;
        Function *callee_proto = f->closure_->GetPrototype();

        callee.func_ = f;
        callee.instruction_ = callee_proto->GetOpCodes();
        callee.end_ = callee.instruction_ + callee_proto->OpCodeSize();
        callee.expect_result_ = expect_result;

        Value *arg = f + 1;
        int fixed_args = callee_proto->FixedArgCount();

        // Fixed arg start from base register
        if (callee_proto->HasVararg())
        {
            Value *top = stack_.top_;
            callee.register_ = top;
            int count = top - arg;
            for (int i = 0; i < count && i < fixed_args; ++i)
                *top++ = *arg++;
        }
        else
        {
            callee.register_ = arg;
            // fill nil for overflow args
            auto new_top = callee.register_ + fixed_args;
            for (auto arg = stack_.top_; arg < new_top; arg++)
            {
                arg->SetNil();
            }
        }

        stack_.SetNewTop(callee.register_ + fixed_args);
        calls_.push_back(callee);
    }